

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXRMultipartImageFromFile
              (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,char *filename,char **err
              )

{
  reference __ptr;
  char *in_RCX;
  int in_EDX;
  long in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  undefined8 *in_R8;
  char **in_stack_00000018;
  uchar *in_stack_00000020;
  uint in_stack_0000002c;
  EXRHeader **in_stack_00000030;
  EXRImage *in_stack_00000038;
  size_t ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t filesize;
  FILE *fp;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  size_type in_stack_ffffffffffffff58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  size_t local_40;
  FILE *local_38;
  undefined8 *local_30;
  int local_1c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_10;
  int local_4;
  
  if (((in_RDI == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) || (in_RSI == 0)) ||
     (in_EDX == 0)) {
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = "Invalid argument.";
    }
    local_4 = -3;
  }
  else {
    local_30 = in_R8;
    local_1c = in_EDX;
    local_10 = in_RDI;
    local_38 = fopen(in_RCX,"rb");
    if (local_38 == (FILE *)0x0) {
      if (local_30 != (undefined8 *)0x0) {
        *local_30 = "Cannot read file.";
      }
      local_4 = -6;
    }
    else {
      fseek(local_38,0,2);
      local_40 = ftell(local_38);
      fseek(local_38,0,0);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x161ea5);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                 (allocator_type *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x161ec5);
      __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_58,0);
      fread(__ptr,1,local_40,local_38);
      fclose(local_38);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                (local_10,CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      local_4 = LoadEXRMultipartImageFromMemory
                          (in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_00000020,
                           in_stack_00000018);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(local_1c,in_stack_ffffffffffffff50));
    }
  }
  return local_4;
}

Assistant:

int LoadEXRMultipartImageFromFile(EXRImage *exr_images,
                                  const EXRHeader **exr_headers,
                                  unsigned int num_parts, const char *filename,
                                  const char **err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts == 0) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

#ifdef _WIN32
  FILE *fp = NULL;
  fopen_s(&fp, filename, "rb");
#else
  FILE *fp = fopen(filename, "rb");
#endif
  if (!fp) {
    if (err) {
      (*err) = "Cannot read file.";
    }
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = static_cast<size_t>(ftell(fp));
  fseek(fp, 0, SEEK_SET);

  std::vector<unsigned char> buf(filesize);  // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    fclose(fp);
    (void)ret;
  }

  return LoadEXRMultipartImageFromMemory(exr_images, exr_headers, num_parts,
                                         &buf.at(0), err);
}